

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O3

int byteoffset(lua_State *L)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  lua_Integer lVar5;
  ulong uVar6;
  lua_Integer def;
  long lVar7;
  ulong uVar8;
  size_t len;
  ulong local_30;
  
  pcVar4 = luaL_checklstring(L,1,&local_30);
  lVar5 = luaL_checkinteger(L,2);
  def = 1;
  if (lVar5 < 0) {
    def = local_30 + 1;
  }
  uVar6 = luaL_optinteger(L,3,def);
  if ((long)uVar6 < 0) {
    if (-uVar6 <= local_30) {
      uVar6 = uVar6 + local_30 + 1;
      goto LAB_00124c40;
    }
    uVar6 = 0;
LAB_00124c24:
    luaL_argerror(L,3,"position out of bounds");
    uVar8 = uVar6;
  }
  else {
LAB_00124c40:
    uVar8 = uVar6 - 1;
    if (((long)uVar6 < 1) || (uVar6 = uVar8, (long)local_30 < (long)uVar8)) goto LAB_00124c24;
  }
  if (lVar5 == 0) {
LAB_00124d34:
    lVar7 = uVar8 + 1;
    lua_pushinteger(L,lVar7);
    if (pcVar4[uVar8] < '\0') {
      lVar7 = uVar8 + 2;
    }
    lua_pushinteger(L,lVar7);
    iVar3 = 2;
  }
  else {
    if (lVar5 < 0) {
      uVar6 = uVar8;
      if (0 < (long)uVar8) {
        while (1 < uVar6) {
          uVar8 = uVar6 - 1;
          lVar7 = lVar5 + 1;
          if ((-2 < lVar5) || (bVar2 = (long)uVar6 < 2, lVar5 = lVar7, uVar6 = uVar8, bVar2))
          goto LAB_00124d20;
        }
        lVar7 = lVar5 + 1;
        uVar8 = 0;
        goto LAB_00124d20;
      }
    }
    else {
      lVar7 = lVar5 + -1;
      if (lVar5 != 1) {
        do {
          if ((long)local_30 <= (long)uVar8) break;
          uVar8 = uVar8 + 1;
          lVar1 = lVar7 + -1;
          bVar2 = 1 < lVar7;
          lVar7 = lVar1;
        } while (bVar2);
      }
LAB_00124d20:
      if (lVar7 == 0) goto LAB_00124d34;
    }
    lua_pushnil(L);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int byteoffset (lua_State *L) {
  size_t len;
  const char *s = luaL_checklstring(L, 1, &len);
  lua_Integer n  = luaL_checkinteger(L, 2);
  lua_Integer posi = (n >= 0) ? 1 : cast_st2S(len) + 1;
  posi = u_posrelat(luaL_optinteger(L, 3, posi), len);
  luaL_argcheck(L, 1 <= posi && --posi <= (lua_Integer)len, 3,
                   "position out of bounds");
  if (n == 0) {
    /* find beginning of current byte sequence */
    while (posi > 0 && iscontp(s + posi)) posi--;
  }
  else {
    if (iscontp(s + posi))
      return luaL_error(L, "initial position is a continuation byte");
    if (n < 0) {
      while (n < 0 && posi > 0) {  /* move back */
        do {  /* find beginning of previous character */
          posi--;
        } while (posi > 0 && iscontp(s + posi));
        n++;
      }
    }
    else {
      n--;  /* do not move for 1st character */
      while (n > 0 && posi < (lua_Integer)len) {
        do {  /* find beginning of next character */
          posi++;
        } while (iscontp(s + posi));  /* (cannot pass final '\0') */
        n--;
      }
    }
  }
  if (n != 0) {  /* did not find given character? */
    luaL_pushfail(L);
    return 1;
  }
  lua_pushinteger(L, posi + 1);  /* initial position */
  if ((s[posi] & 0x80) != 0) {  /* multi-byte character? */
    do {
      posi++;
    } while (iscontp(s + posi + 1));  /* skip to final byte */
  }
  /* else one-byte character: final position is the initial one */
  lua_pushinteger(L, posi + 1);  /* 'posi' now is the final position */
  return 2;
}